

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ShortRealToBitsFunction::eval
          (ShortRealToBitsFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  Expression *in_RDI;
  shortreal_t sVar2;
  ConstantValue val;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  bitwidth_t bits;
  Expression *this_00;
  shortreal_t local_7c [5];
  undefined4 local_68;
  
  this_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_RDI,(EvalContext *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  bits = (bitwidth_t)((ulong)in_RDI >> 0x20);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x95845b);
  if (bVar1) {
    sVar2 = slang::ConstantValue::shortReal
                      ((ConstantValue *)
                       CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    local_7c[0] = sVar2;
    std::bit_cast<unsigned_int,_slang::shortreal_t>(local_7c);
    SVInt::SVInt((SVInt *)this_00,bits,CONCAT44(sVar2.v,in_stack_ffffffffffffff60),
                 (bool)in_stack_ffffffffffffff5f);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(sVar2.v,in_stack_ffffffffffffff60),
               (SVInt *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    SVInt::~SVInt((SVInt *)this_00);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (nullptr_t)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  }
  local_68 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x958523);
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto val = args[0]->eval(context);
        if (!val)
            return nullptr;

        return SVInt(32, std::bit_cast<uint32_t>(val.shortReal()), false);
    }